

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.h
# Opt level: O0

IRBuiltinFunction * __thiscall
flow::IRProgram::getBuiltinFunction(IRProgram *this,NativeCallback *cb)

{
  bool bVar1;
  reference pvVar2;
  pointer pIVar3;
  Signature *this_00;
  Signature *v;
  undefined1 local_38 [16];
  size_t e;
  size_t i;
  NativeCallback *cb_local;
  IRProgram *this_local;
  
  e = 0;
  i = (size_t)cb;
  cb_local = (NativeCallback *)this;
  local_38._8_8_ =
       std::
       vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
       ::size(&this->builtinFunctions_);
  while( true ) {
    if (e == local_38._8_8_) {
      std::make_unique<flow::IRBuiltinFunction,flow::NativeCallback_const&>
                ((NativeCallback *)local_38);
      std::
      vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
      ::
      emplace_back<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>
                ((vector<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>,std::allocator<std::unique_ptr<flow::IRBuiltinFunction,std::default_delete<flow::IRBuiltinFunction>>>>
                  *)&this->builtinFunctions_,
                 (unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                  *)local_38);
      std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>::
      ~unique_ptr((unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
                   *)local_38);
      pvVar2 = std::
               vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
               ::back(&this->builtinFunctions_);
      pIVar3 = std::
               unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>::
               get(pvVar2);
      return pIVar3;
    }
    pvVar2 = std::
             vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
             ::operator[](&this->builtinFunctions_,e);
    pIVar3 = std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>
             ::operator->(pvVar2);
    this_00 = IRBuiltinFunction::signature(pIVar3);
    v = NativeCallback::signature((NativeCallback *)i);
    bVar1 = Signature::operator==(this_00,v);
    if (bVar1) break;
    e = e + 1;
  }
  pvVar2 = std::
           vector<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>,_std::allocator<std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>_>_>
           ::operator[](&this->builtinFunctions_,e);
  pIVar3 = std::unique_ptr<flow::IRBuiltinFunction,_std::default_delete<flow::IRBuiltinFunction>_>::
           get(pvVar2);
  return pIVar3;
}

Assistant:

IRBuiltinFunction* getBuiltinFunction(const NativeCallback& cb) {
    for (size_t i = 0, e = builtinFunctions_.size(); i != e; ++i)
      if (builtinFunctions_[i]->signature() == cb.signature())
        return builtinFunctions_[i].get();

    builtinFunctions_.emplace_back(std::make_unique<IRBuiltinFunction>(cb));
    return builtinFunctions_.back().get();
  }